

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaSetValidOptions(xmlSchemaValidCtxtPtr ctxt,int options)

{
  uint uVar1;
  uint uVar2;
  
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    uVar2 = 1;
    do {
      if (uVar2 == 0x20) {
        ctxt->options = options;
        return 0;
      }
      uVar1 = uVar2 & 0x1f;
      uVar2 = uVar2 + 1;
    } while (((uint)options >> uVar1 & 1) == 0);
  }
  return -1;
}

Assistant:

int
xmlSchemaSetValidOptions(xmlSchemaValidCtxtPtr ctxt,
			 int options)

{
    int i;

    if (ctxt == NULL)
	return (-1);
    /*
    * WARNING: Change the start value if adding to the
    * xmlSchemaValidOption.
    * TODO: Is there an other, more easy to maintain,
    * way?
    */
    for (i = 1; i < (int) sizeof(int) * 8; i++) {
        if (options & 1<<i)
	    return (-1);
    }
    ctxt->options = options;
    return (0);
}